

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

PNode * commit_tree(Parser *p,PNode *pn)

{
  uint32 *puVar1;
  VecPNode *v;
  PNode **ppPVar2;
  int iVar3;
  uint uVar4;
  PNode *pPVar5;
  D_ReductionCode p_Var6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  D_ParseNode *pDVar11;
  PNode *pPVar12;
  PNode **ppPVar13;
  uint uVar14;
  ulong uVar15;
  PNode *pn_00;
  int iVar16;
  uint uVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  uint local_58 [2];
  D_ParseNode **local_50;
  D_ParseNode *local_48 [3];
  uint uVar17;
  
  pn_00 = pn->latest;
  while (pPVar12 = pn_00->latest, pn_00 != pPVar12) {
    pPVar12->refcount = pPVar12->refcount + 1;
    puVar1 = &pn_00->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      free_PNode(p,pn_00);
    }
    pn->latest = pPVar12;
    pn_00 = pPVar12;
  }
  if (pn_00->evaluated != '\0') {
    return pn_00;
  }
  if ((pn_00->parse_node).start_loc.s == (pn_00->parse_node).end) {
    if ((pn_00->reduction == (D_Reduction *)0x0) ||
       (pn_00->reduction->final_code == (D_ReductionCode)0x0)) {
      pn_00->evaluated = '\x01';
    }
    if (pn_00->ambiguities == (PNode *)0x0) goto LAB_00142398;
    iVar8 = final_actionless(pn_00);
    bVar21 = iVar8 != 0;
  }
  else {
    pn_00->evaluated = '\x01';
    if (pn_00->ambiguities == (PNode *)0x0) goto LAB_00142398;
    bVar21 = false;
  }
  local_48[0] = &pn_00->parse_node;
  local_58[0] = 1;
  local_50 = local_48;
LAB_00142267:
  pPVar12 = pn_00->ambiguities;
  if (pPVar12 != (PNode *)0x0) {
    pn_00 = pPVar12->latest;
    while (pPVar5 = pn_00->latest, pn_00 != pPVar5) {
      pPVar5->refcount = pPVar5->refcount + 1;
      puVar1 = &pn_00->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_PNode(p,pn_00);
      }
      pPVar12->latest = pPVar5;
      pn_00 = pPVar5;
    }
    if (((!(bool)((p->user).dont_merge_epsilon_trees == 0 & bVar21)) ||
        ((pn_00->parse_node).start_loc.s != (pn_00->parse_node).end)) ||
       (iVar8 = final_actionless(pn_00), iVar8 == 0)) {
      uVar10 = (ulong)local_58[0];
      pDVar11 = &pn_00->parse_node;
      bVar7 = false;
      for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
        if (local_50[uVar15] == pDVar11) {
          bVar7 = true;
        }
      }
      if (!bVar7) {
        if (local_50 != (D_ParseNode **)0x0) {
          if (local_50 == local_48) {
            if (2 < local_58[0]) goto LAB_0014233c;
          }
          else if ((local_58[0] & 7) == 0) {
LAB_0014233c:
            vec_add_internal(local_58,pDVar11);
            goto LAB_00142267;
          }
          local_58[0] = local_58[0] + 1;
          local_50[uVar10] = pDVar11;
          goto LAB_00142267;
        }
        local_58[0] = local_58[0] + 1;
        local_48[uVar10] = pDVar11;
        local_50 = local_48;
      }
    }
    goto LAB_00142267;
  }
  if (local_58[0] == 1) {
    pDVar11 = *local_50;
  }
  else {
    pDVar11 = (*(p->user).ambiguity_fn)(&p->user,local_58[0],local_50);
  }
  if (local_50 != local_48 && local_50 != (D_ParseNode **)0x0) {
    free(local_50);
  }
  if (pDVar11 == (D_ParseNode *)0x0) {
    return (PNode *)0x0;
  }
  pn_00 = (PNode *)(pDVar11 + -2);
LAB_00142398:
  iVar8 = (p->user).fixup_EBNF_productions;
  uVar9 = p->t->symbols[(pn_00->parse_node).symbol].kind & 0xfffffffe;
  iVar3 = (p->user).dont_fixup_internal_productions;
  v = &pn_00->children;
  ppPVar2 = (pn_00->children).e;
  uVar10 = 0;
  do {
    uVar18 = (uint)uVar10;
    if (v->n <= uVar18) {
      if ((pn_00->reduction != (D_Reduction *)0x0) &&
         (p_Var6 = pn_00->reduction->final_code, p_Var6 != (D_ReductionCode)0x0)) {
        (*p_Var6)(pn_00,(pn_00->children).v,v->n,0x90,&p->user);
      }
      if (((pn_00->evaluated != '\0') && ((p->user).save_parse_tree == 0)) && (uVar9 != 2)) {
        free_ParseTreeBelow(p,pn_00);
      }
      return pn_00;
    }
    pPVar12 = commit_tree(p,(pn_00->children).v[uVar10]);
    if (pPVar12 == (PNode *)0x0) {
      return (PNode *)0x0;
    }
    ppPVar13 = (pn_00->children).v;
    pPVar5 = ppPVar13[uVar10];
    if (pPVar12 != pPVar5) {
      pPVar12->refcount = pPVar12->refcount + 1;
      puVar1 = &pPVar5->refcount;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        free_PNode(p,pPVar5);
        ppPVar13 = (pn_00->children).v;
      }
      ppPVar13[uVar10] = pPVar12;
    }
    if (uVar9 == 2 && iVar3 == 0) {
      ppPVar13 = (pn_00->children).v;
      uVar14 = p->t->symbols[(ppPVar13[uVar10]->parse_node).symbol].kind;
      if (iVar8 != 0) {
        uVar14 = uVar14 & 0xfffffffe;
      }
      if (uVar14 == 2) {
        lVar20 = (long)(int)uVar18;
        pPVar12 = ppPVar13[lVar20];
        uVar14 = (pPVar12->children).n;
        uVar10 = (ulong)uVar14;
        uVar4 = (pn_00->children).n;
        lVar19 = (long)(int)uVar4;
        if (pPVar12 == pn_00) {
          d_fail("circular parse: unable to fixup internal symbol");
        }
        if (uVar14 == 1) {
          pPVar5 = *(pPVar12->children).v;
          puVar1 = &pPVar5->refcount;
          *puVar1 = *puVar1 + 1;
          (pn_00->children).v[lVar20] = pPVar5;
        }
        else if (uVar14 == 0) {
          for (; lVar20 < lVar19 + -1; lVar20 = lVar20 + 1) {
            ppPVar13 = (pn_00->children).v;
            ppPVar13[lVar20] = ppPVar13[lVar20 + 1];
          }
          v->n = v->n - 1;
        }
        else {
          uVar17 = 1;
          if (1 < (int)uVar14) {
            uVar17 = uVar14;
          }
          iVar16 = uVar17 - 1;
          while (bVar21 = iVar16 != 0, iVar16 = iVar16 + -1, bVar21) {
            ppPVar13 = (pn_00->children).v;
            if (ppPVar13 == (PNode **)0x0) {
              (pn_00->children).v = ppPVar2;
              uVar17 = (pn_00->children).n;
              (pn_00->children).n = uVar17 + 1;
              (pn_00->children).e[uVar17] = (PNode *)0x0;
            }
            else {
              uVar17 = v->n;
              if (ppPVar13 == ppPVar2) {
                if (2 < uVar17) goto LAB_0014257d;
LAB_00142552:
                v->n = uVar17 + 1;
                ppPVar13[uVar17] = (PNode *)0x0;
              }
              else {
                if ((uVar17 & 7) != 0) goto LAB_00142552;
LAB_0014257d:
                vec_add_internal(v,(void *)0x0);
              }
            }
          }
          iVar16 = uVar14 + uVar4 + -2;
          for (; (int)(uVar18 + 1) < lVar19; lVar19 = lVar19 + -1) {
            ppPVar13 = (pn_00->children).v;
            ppPVar13[iVar16] = ppPVar13[lVar19 + -1];
            iVar16 = iVar16 + -1;
          }
          if ((int)uVar14 < 1) {
            uVar10 = 0;
          }
          for (uVar15 = 0; uVar10 != uVar15; uVar15 = uVar15 + 1) {
            pPVar5 = (pPVar12->children).v[uVar15];
            puVar1 = &pPVar5->refcount;
            *puVar1 = *puVar1 + 1;
            (pn_00->children).v[lVar20 + uVar15] = pPVar5;
          }
        }
        puVar1 = &pPVar12->refcount;
        *puVar1 = *puVar1 - 1;
        if (*puVar1 == 0) {
          free_PNode(p,pPVar12);
        }
        uVar18 = uVar18 - 1;
      }
    }
    uVar10 = (ulong)(uVar18 + 1);
  } while( true );
}

Assistant:

static PNode *commit_tree(Parser *p, PNode *pn) {
  uint i, fixup_ebnf = 0, fixup = 0, internal = 0;
  LATEST(p, pn);
  if (pn->evaluated) return pn;
  if (!is_unreduced_epsilon_PNode(pn)) pn->evaluated = 1;
  if (pn->ambiguities) pn = resolve_ambiguities(p, pn);
  if (!pn) return NULL;
  fixup_ebnf = p->user.fixup_EBNF_productions;
  internal = is_symbol_internal_or_EBNF(p, pn);
  fixup = !p->user.dont_fixup_internal_productions && internal;
  for (i = 0; i < pn->children.n; i++) {
    PNode *tpn = commit_tree(p, pn->children.v[i]);
    if (!tpn) return NULL;
    if (tpn != pn->children.v[i]) {
      ref_pn(tpn);
      unref_pn(p, pn->children.v[i]);
      pn->children.v[i] = tpn;
    }
    if (fixup &&
        (fixup_ebnf ? is_symbol_internal_or_EBNF(p, pn->children.v[i]) : is_symbol_internal(p, pn->children.v[i]))) {
      fixup_internal_symbol(p, pn, i);
      i -= 1;
      continue;
    }
  }
  if (pn->reduction) DBG(printf("commit %p (%s)\n", (void *)pn, p->t->symbols[pn->parse_node.symbol].name));
  if (pn->reduction && pn->reduction->final_code) {
    void **v0 = pn->children.v == NULL ?  NULL : (void **)&pn->children.v[0];
    pn->reduction->final_code(pn, v0, pn->children.n, (intptr_t)(sizeof(PNode) - sizeof(D_ParseNode)),
                              (D_Parser *)p);
  }
  if (pn->evaluated) {
    if (!p->user.save_parse_tree && !internal) free_ParseTreeBelow(p, pn);
  }
  return pn;
}